

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O2

TSTNode<unsigned_int> * __thiscall
BurstRecursive<unsigned_int>::operator()
          (BurstRecursive<unsigned_int> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,uint *oracle,
          size_t depth)

{
  uint *puVar1;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_00;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_01;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_02;
  pointer ppuVar2;
  TSTNode<unsigned_int> *pTVar3;
  BurstRecursive<unsigned_int> *this_03;
  uint32_t uVar4;
  uint uVar5;
  ostream *poVar6;
  ulong uVar7;
  TSTNode<unsigned_int> *pTVar8;
  ulong uVar9;
  ulong uVar10;
  BurstSimple<unsigned_int> local_61;
  TSTNode<unsigned_int> *local_60;
  ulong local_58;
  uint *local_50;
  BurstRecursive<unsigned_int> *local_48;
  long local_40;
  DI __d;
  
  local_48 = this;
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"BurstRecursive() bucket.size()=");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," depth=");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  local_50 = oracle;
  local_60 = BurstSimple<unsigned_int>::operator()(&local_61,bucket,oracle,depth);
  this_00 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
            (local_60->buckets)._M_elems[0];
  this_01 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
            (local_60->buckets)._M_elems[1];
  this_02 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
            (local_60->buckets)._M_elems[2];
  uVar9 = (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar10 = (long)(this_00->_M_impl).super__Vector_impl_data._M_finish -
           (long)(this_00->_M_impl).super__Vector_impl_data._M_start >> 3;
  uVar7 = (long)(this_01->_M_impl).super__Vector_impl_data._M_finish -
          (long)(this_01->_M_impl).super__Vector_impl_data._M_start >> 3;
  local_40 = uVar7 + uVar10;
  if (((long)(this_02->_M_impl).super__Vector_impl_data._M_finish -
       (long)(this_02->_M_impl).super__Vector_impl_data._M_start >> 3) + local_40 == uVar9) {
    uVar9 = (ulong)((float)uVar9 * 0.7);
    local_58 = 100;
    if (100 < (uint)uVar9) {
      local_58 = uVar9;
    }
    local_58 = local_58 & 0xffffffff;
    if (local_58 < uVar10) {
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"BurstRecursive() bursting bucket0: size()=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," threshold=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," bsize=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6,"\n");
      uVar5 = 0;
      while( true ) {
        uVar7 = (ulong)uVar5;
        ppuVar2 = (this_00->_M_impl).super__Vector_impl_data._M_start;
        if ((ulong)((long)(this_00->_M_impl).super__Vector_impl_data._M_finish - (long)ppuVar2 >> 3)
            <= uVar7) break;
        uVar4 = get_char<unsigned_int>(ppuVar2[uVar7],depth);
        local_50[uVar7] = uVar4;
        uVar5 = uVar5 + 1;
      }
      pTVar8 = operator()(local_48,(vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                                   this_00,local_50,depth);
      pTVar3 = local_60;
      (local_60->buckets)._M_elems[0] = pTVar8;
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(this_00);
      operator_delete(this_00);
      *(byte *)&(pTVar3->is_tst).super__Base_bitset<1UL>._M_w =
           (byte)(pTVar3->is_tst).super__Base_bitset<1UL>._M_w | 1;
      uVar7 = (long)(this_01->_M_impl).super__Vector_impl_data._M_finish -
              (long)(this_01->_M_impl).super__Vector_impl_data._M_start >> 3;
    }
    if ((local_58 < uVar7) && ((char)local_60->pivot != '\0')) {
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"BurstRecursive() bursting bucket1: size()=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," threshold=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," bsize=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6,"\n");
      puVar1 = local_50 + uVar10;
      uVar5 = 0;
      while( true ) {
        uVar7 = (ulong)uVar5;
        ppuVar2 = (this_01->_M_impl).super__Vector_impl_data._M_start;
        if ((ulong)((long)(this_01->_M_impl).super__Vector_impl_data._M_finish - (long)ppuVar2 >> 3)
            <= uVar7) break;
        uVar4 = get_char<unsigned_int>(ppuVar2[uVar7],depth + 4);
        puVar1[uVar7] = uVar4;
        uVar5 = uVar5 + 1;
      }
      pTVar8 = operator()(local_48,(vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                                   this_01,puVar1,depth + 4);
      pTVar3 = local_60;
      (local_60->buckets)._M_elems[1] = pTVar8;
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(this_01);
      operator_delete(this_01);
      *(byte *)&(pTVar3->is_tst).super__Base_bitset<1UL>._M_w =
           (byte)(pTVar3->is_tst).super__Base_bitset<1UL>._M_w | 2;
    }
    if (local_58 <
        (ulong)((long)(this_02->_M_impl).super__Vector_impl_data._M_finish -
                (long)(this_02->_M_impl).super__Vector_impl_data._M_start >> 3)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"BurstRecursive() bursting bucket2: size()=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," threshold=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," bsize=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6,"\n");
      this_03 = local_48;
      puVar1 = local_50 + local_40;
      uVar5 = 0;
      while( true ) {
        uVar7 = (ulong)uVar5;
        ppuVar2 = (this_02->_M_impl).super__Vector_impl_data._M_start;
        if ((ulong)((long)(this_02->_M_impl).super__Vector_impl_data._M_finish - (long)ppuVar2 >> 3)
            <= uVar7) break;
        uVar4 = get_char<unsigned_int>(ppuVar2[uVar7],depth);
        puVar1[uVar7] = uVar4;
        uVar5 = uVar5 + 1;
      }
      pTVar8 = operator()(this_03,(vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                                  this_02,puVar1,depth);
      pTVar3 = local_60;
      (local_60->buckets)._M_elems[2] = pTVar8;
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(this_02);
      operator_delete(this_02);
      *(byte *)&(pTVar3->is_tst).super__Base_bitset<1UL>._M_w =
           (byte)(pTVar3->is_tst).super__Base_bitset<1UL>._M_w | 4;
    }
    operator()<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::DI::~DI(&__d);
    return local_60;
  }
  __assert_fail("bucket0->size() + bucket1->size() + bucket2->size() == bucket.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                ,0x6c,
                "TSTNode<CharT> *BurstRecursive<unsigned int>::operator()(const BucketT &, CharT *, size_t) const [CharT = unsigned int, BucketT = std::vector<unsigned char *>]"
               );
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t depth) const
	{
		debug() << "BurstRecursive() bucket.size()=" << bucket.size() << " depth=" << depth << "\n"; debug_indent;
		TSTNode<CharT>* new_node
			= BurstSimple<CharT>()(bucket, oracle, depth);
		BucketT* bucket0 = static_cast<BucketT*>(new_node->buckets[0]);
		BucketT* bucket1 = static_cast<BucketT*>(new_node->buckets[1]);
		BucketT* bucket2 = static_cast<BucketT*>(new_node->buckets[2]);
		const unsigned threshold = std::max(100u,
				unsigned(0.7f*bucket.size()));
		assert(bucket0->size() + bucket1->size() + bucket2->size()
				== bucket.size());
		size_t bsize = 0;
		const size_t bsize0 = bucket0->size();
		const size_t bsize1 = bucket1->size();
		if (bucket0->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket0: size()=" << bucket0->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket0->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket0)[i], depth);
			new_node->buckets[0] = this->operator()(*bucket0,
					oracle, depth);
			delete bucket0;
			new_node->is_tst[0] = true;
		}
		bsize += bsize0;
		if (bucket1->size() > threshold and not is_end(new_node->pivot)) {
			debug() << "BurstRecursive() bursting bucket1: size()=" << bucket1->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket1->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket1)[i], depth+sizeof(CharT));
			new_node->buckets[1] = this->operator()(*bucket1,
					oracle+bsize, depth+sizeof(CharT));
			delete bucket1;
			new_node->is_tst[1] = true;
		}
		bsize += bsize1;
		if (bucket2->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket2: size()=" << bucket2->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket2->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket2)[i], depth);
			new_node->buckets[2] = this->operator()(*bucket2,
					oracle+bsize, depth);
			delete bucket2;
			new_node->is_tst[2] = true;
		}
		return new_node;
	}